

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O2

string * __thiscall S2CellId::ToToken_abi_cxx11_(string *__return_storage_ptr__,S2CellId *this)

{
  ulong uVar1;
  string *result;
  long lVar2;
  ulong uVar3;
  allocator local_19;
  
  uVar3 = this->id_;
  if (uVar3 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"X",&local_19);
  }
  else {
    uVar1 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    uVar3 = uVar3 >> ((byte)uVar1 & 0x3c);
    lVar2 = 0x10 - (uVar1 >> 2 & 0x3fffffff);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)lVar2);
    while (lVar2 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar2 + -1] = "0123456789abcdef"[(uint)uVar3 & 0xf]
      ;
      uVar3 = uVar3 >> 4;
      lVar2 = lVar2 + -1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string S2CellId::ToToken() const {
  // Simple implementation: print the id in hex without trailing zeros.
  // Using hex has the advantage that the tokens are case-insensitive, all
  // characters are alphanumeric, no characters require any special escaping
  // in queries for most indexing systems, and it's easy to compare cell
  // tokens against the feature ids of the corresponding features.
  //
  // Using base 64 would produce slightly shorter tokens, but for typical cell
  // sizes used during indexing (up to level 15 or so) the average savings
  // would be less than 2 bytes per cell which doesn't seem worth it.

  // "0" with trailing 0s stripped is the empty string, which is not a
  // reasonable token.  Encode as "X".
  if (id_ == 0) return "X";
  const size_t num_zero_digits = Bits::FindLSBSetNonZero64(id_) / 4;
  return HexFormatString(id_ >> (4 * num_zero_digits), 16 - num_zero_digits);
}